

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnFixedString::Append(ColumnFixedString *this,ColumnRef *column)

{
  shared_ptr<clickhouse::ColumnFixedString> col;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnFixedString>((Column *)&stack0xffffffffffffffe0);
  if ((local_20 != (_func_int **)0x0) && ((_func_int *)this->string_size_ == local_20[5])) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_,
               (this->data_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20[6],
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20[7]);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnFixedString::Append(ColumnRef column) {
    if (auto col = column->As<ColumnFixedString>()) {
        if (string_size_ == col->string_size_) {
            data_.insert(data_.end(), col->data_.begin(), col->data_.end());
        }
    }
}